

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_dpg.h
# Opt level: O0

void __thiscall
projects::dpg::ReactionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>
::ReactionElementMatrixProvider
          (ReactionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>
           *this,shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *fe_space_trial,
          shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *fe_space_test,
          size_type trial_component,size_type test_component,MeshFunctionConstant<double> gamma)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  ScalarReferenceFiniteElement<double> *fe;
  ScalarReferenceFiniteElement<double> *fe_00;
  reference pvVar5;
  QuadRule local_210;
  PrecomputedScalarReferenceFiniteElement<double> local_1e0;
  QuadRule local_170;
  PrecomputedScalarReferenceFiniteElement<double> local_140;
  RefElType local_c9;
  undefined1 local_c8 [8];
  QuadRule qr;
  size_type degree;
  ScalarReferenceFiniteElement<double> *fe_test;
  ScalarReferenceFiniteElement<double> *fe_trial;
  const_iterator pRStack_70;
  RefEl ref_el;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<lf::base::RefEl> local_58;
  initializer_list<lf::base::RefEl> *local_48;
  initializer_list<lf::base::RefEl> *__range2;
  size_type local_30;
  size_type local_2c;
  size_type test_component_local;
  size_type trial_component_local;
  shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *fe_space_test_local;
  shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *fe_space_trial_local;
  ReactionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_> *this_local;
  MeshFunctionConstant<double> gamma_local;
  
  local_30 = test_component;
  local_2c = trial_component;
  _test_component_local = fe_space_test;
  fe_space_test_local = fe_space_trial;
  fe_space_trial_local = (shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *)this;
  this_local = (ReactionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>
                *)gamma.value_;
  SubElementMatrixProvider<double>::SubElementMatrixProvider
            (&this->super_SubElementMatrixProvider<double>);
  (this->super_SubElementMatrixProvider<double>)._vptr_SubElementMatrixProvider =
       (_func_int **)&PTR__ReactionElementMatrixProvider_00898178;
  (this->gamma_).value_ = (double)this_local;
  memset(&this->fe_precomp_trial_,0,0x230);
  std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::array
            (&this->fe_precomp_trial_);
  memset(&this->fe_precomp_test_,0,0x230);
  std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::array
            (&this->fe_precomp_test_);
  this->trial_component_ = local_2c;
  this->test_component_ = local_30;
  __begin2._6_1_ = lf::base::RefEl::kTria();
  __begin2._7_1_ = lf::base::RefEl::kQuad();
  local_58._M_array = (iterator)((long)&__begin2 + 6);
  local_58._M_len = 2;
  local_48 = &local_58;
  __end2 = std::initializer_list<lf::base::RefEl>::begin(local_48);
  pRStack_70 = std::initializer_list<lf::base::RefEl>::end(local_48);
  for (; __end2 != pRStack_70; __end2 = __end2 + 1) {
    fe_trial._7_1_ = (RefEl)__end2->type_;
    peVar4 = std::
             __shared_ptr_access<projects::dpg::ProductUniformFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<projects::dpg::ProductUniformFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)fe_space_trial);
    fe = ProductUniformFESpace<double>::ShapeFunctionLayout
                   (peVar4,fe_trial._7_1_,this->trial_component_);
    peVar4 = std::
             __shared_ptr_access<projects::dpg::ProductUniformFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<projects::dpg::ProductUniformFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)fe_space_test);
    qr.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
    _7_1_ = fe_trial._7_1_;
    fe_00 = ProductUniformFESpace<double>::ShapeFunctionLayout
                      (peVar4,fe_trial._7_1_,this->test_component_);
    if ((fe != (ScalarReferenceFiniteElement<double> *)0x0) &&
       (fe_00 != (ScalarReferenceFiniteElement<double> *)0x0)) {
      iVar1 = (*fe->_vptr_ScalarReferenceFiniteElement[3])();
      iVar2 = (*fe_00->_vptr_ScalarReferenceFiniteElement[3])();
      qr.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
      _0_4_ = iVar1 + iVar2;
      local_c9 = fe_trial._7_1_;
      lf::quad::make_QuadRule
                ((QuadRule *)local_c8,fe_trial._7_1_,
                 (uint)qr.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows);
      lf::quad::QuadRule::QuadRule(&local_170,(QuadRule *)local_c8);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      PrecomputedScalarReferenceFiniteElement(&local_140,fe,&local_170);
      uVar3 = lf::base::RefEl::Id((RefEl *)((long)&fe_trial + 7));
      pvVar5 = std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::
               operator[](&this->fe_precomp_trial_,(ulong)uVar3);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::operator=(pvVar5,&local_140);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      ~PrecomputedScalarReferenceFiniteElement(&local_140);
      lf::quad::QuadRule::~QuadRule(&local_170);
      lf::quad::QuadRule::QuadRule(&local_210,(QuadRule *)local_c8);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      PrecomputedScalarReferenceFiniteElement(&local_1e0,fe_00,&local_210);
      uVar3 = lf::base::RefEl::Id((RefEl *)((long)&fe_trial + 7));
      pvVar5 = std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::
               operator[](&this->fe_precomp_test_,(ulong)uVar3);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::operator=(pvVar5,&local_1e0);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      ~PrecomputedScalarReferenceFiniteElement(&local_1e0);
      lf::quad::QuadRule::~QuadRule(&local_210);
      lf::quad::QuadRule::~QuadRule((QuadRule *)local_c8);
    }
  }
  return;
}

Assistant:

ReactionElementMatrixProvider<SCALAR, REACTION_COEFF>::
    ReactionElementMatrixProvider(
        std::shared_ptr<ProductUniformFESpace<SCALAR>> fe_space_trial,
        std::shared_ptr<ProductUniformFESpace<SCALAR>> fe_space_test,
        size_type trial_component, size_type test_component,
        REACTION_COEFF gamma)
    : gamma_(std::move(gamma)),
      trial_component_(trial_component),
      test_component_(test_component),
      fe_precomp_trial_(),
      fe_precomp_test_() {
  for (auto ref_el : {lf::base::RefEl::kTria(), lf::base::RefEl::kQuad()}) {
    // obtain descriptions of local shape functions.
    auto fe_trial =
        fe_space_trial->ShapeFunctionLayout(ref_el, trial_component_);
    auto fe_test = fe_space_test->ShapeFunctionLayout(ref_el, test_component_);

    // check, that  shape functions for both the trial and test space component
    // for that entity are available.
    // Note that the corresponding PrecomputedScalarReferenceFiniteElement local
    // object is not initialized if the associated description of local shape
    // functions is missing.
    if (fe_trial != nullptr && fe_test != nullptr) {
      // use a quadrature rule whose degree is the sum of the degrees of the fe
      // spaces.
      size_type degree = fe_trial->Degree() + fe_test->Degree();
      lf::quad::QuadRule qr = lf::quad::make_QuadRule(ref_el, degree);
      // Precompute cell-independent quantities.
      fe_precomp_trial_[ref_el.Id()] =
          lf::uscalfe::PrecomputedScalarReferenceFiniteElement(fe_trial, qr);
      fe_precomp_test_[ref_el.Id()] =
          lf::uscalfe::PrecomputedScalarReferenceFiniteElement(fe_test, qr);
    }
  }
}